

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record(ThreadContextTTD *this)

{
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int iVar1;
  Type pSVar2;
  bool bVar3;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_01;
  ulong uVar4;
  int nextIndex;
  int iVar5;
  int nextIndex_1;
  int iVar6;
  int lastIndex;
  
  CleanRecordWeakRootMap(this);
  this_00 = &this->m_ttdRootTagToObjectMap;
  for (uVar4 = 0; uVar4 < (this->m_ttdRootTagToObjectMap).bucketCount; uVar4 = uVar4 + 1) {
    if (this_00->buckets[uVar4] != -1) {
      iVar1 = this_00->buckets[uVar4];
      iVar5 = -1;
      while (iVar6 = iVar5, iVar5 = iVar1, iVar5 != -1) {
        pSVar2 = (this->m_ttdRootTagToObjectMap).entries;
        this_01 = Memory::
                  RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
                  ::operator->(&this->m_ttdRecordRootWeakMap);
        bVar3 = JsUtil::
                WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
                ::Lookup(this_01,pSVar2[iVar5].
                                 super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                                 super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                                 .
                                 super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>
                                 .value,false);
        iVar1 = (this->m_ttdRootTagToObjectMap).entries[iVar5].
                super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next;
        if (!bVar3) {
          JsUtil::
          BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::RemoveAt(this_00,iVar5,iVar6,(uint)uVar4);
          iVar5 = iVar6;
        }
      }
    }
  }
  for (uVar4 = 0; uVar4 < (this->m_ttdMayBeLongLivedRoot).bucketCount; uVar4 = uVar4 + 1) {
    iVar1 = (this->m_ttdMayBeLongLivedRoot).buckets[uVar4];
    if (iVar1 != -1) {
      iVar5 = -1;
      while (iVar6 = iVar5, iVar5 = iVar1, iVar5 != -1) {
        bVar3 = JsUtil::
                BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(this_00,&(this->m_ttdMayBeLongLivedRoot).entries[iVar5].
                                       super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                       .super_KeyValueEntry<unsigned_long,_bool>.
                                       super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                                       .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key);
        iVar1 = (this->m_ttdMayBeLongLivedRoot).entries[iVar5].
                super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
        if (!bVar3) {
          JsUtil::
          BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::RemoveAt(&this->m_ttdMayBeLongLivedRoot,iVar5,iVar6,(uint)uVar4);
          iVar5 = iVar6;
        }
      }
    }
  }
  return;
}

Assistant:

void ThreadContextTTD::SyncRootsBeforeSnapshot_Record()
    {
        this->CleanRecordWeakRootMap();

        this->m_ttdRootTagToObjectMap.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, Js::RecyclableObject*>& entry) -> bool
        {
            return !this->m_ttdRecordRootWeakMap->Lookup(entry.Value(), false);
        });

        this->m_ttdMayBeLongLivedRoot.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, bool>& entry) -> bool
        {
            return !this->m_ttdRootTagToObjectMap.ContainsKey(entry.Key());
        });
    }